

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_path.cpp
# Opt level: O1

idx_t duckdb::FindLast(char *data_ptr,idx_t input_size,string *sep_data)

{
  bool bVar1;
  idx_t iVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = 0;
  do {
    if (input_size == 0) break;
    iVar2 = Find(data_ptr,input_size,sep_data);
    lVar3 = iVar2 + 1;
    if (input_size < iVar2) {
      lVar3 = 0;
    }
    lVar4 = lVar4 + lVar3;
    if (iVar2 == 0xffffffffffffffff) break;
    data_ptr = data_ptr + lVar3;
    bVar1 = iVar2 <= input_size;
    input_size = input_size - lVar3;
  } while (bVar1);
  return lVar4 - 1;
}

Assistant:

static idx_t FindLast(const char *data_ptr, idx_t input_size, const string &sep_data) {
	idx_t start = 0;
	while (input_size > 0) {
		auto pos = Find(data_ptr, input_size, sep_data);
		if (!IsIdxValid(pos, input_size)) {
			break;
		}
		start += (pos + 1);
		data_ptr += (pos + 1);
		input_size -= (pos + 1);
	}
	if (start < 1) {
		return DConstants::INVALID_INDEX;
	}
	return start - 1;
}